

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O1

EffectState * __thiscall
anon_unknown.dwarf_13a68a::ChorusStateFactory::create(ChorusStateFactory *this)

{
  EffectState *__s;
  size_t in_RSI;
  
  __s = (EffectState *)(anonymous_namespace)::ChorusState::operator_new((ChorusState *)this,in_RSI);
  memset(__s,0,0x160);
  (__s->super_intrusive_ref<EffectState>).mRef.super___atomic_base<unsigned_int>._M_i = 1;
  (__s->mOutTarget).mData = (pointer)0x0;
  (__s->mOutTarget).mDataEnd = (pointer)0x0;
  __s->_vptr_EffectState = (_func_int **)&PTR__ChorusState_001b0388;
  __s[1]._vptr_EffectState = (_func_int **)0x0;
  *(undefined8 *)&__s[1].super_intrusive_ref<EffectState> = 0;
  __s[1].mOutTarget.mData = (pointer)0x0;
  __s[1].mOutTarget.mDataEnd = (pointer)0x0;
  *(undefined4 *)&__s[2]._vptr_EffectState = 1;
  memset((void *)((long)&__s[2]._vptr_EffectState + 4),0,0x108);
  *(undefined8 *)&__s[10].field_0xc = 0;
  *(undefined8 *)((long)&__s[10].mOutTarget.mData + 4) = 0;
  return __s;
}

Assistant:

EffectState *create() override { return new ChorusState{}; }